

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_linux.h
# Opt level: O2

void snmalloc::PALLinux::wait_on_address<snmalloc::CombiningLockNode::LockStatus>
               (Atomic<snmalloc::CombiningLockNode::LockStatus> *addr,LockStatus expected)

{
  int iVar1;
  ulong in_RAX;
  int *piVar2;
  
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  while (addr->_M_i == expected) {
    in_RAX = in_RAX & 0xffffffff00000000;
    syscall(0xca,addr,0x80,expected,0,0,in_RAX);
  }
  *piVar2 = iVar1;
  return;
}

Assistant:

static void wait_on_address(stl::Atomic<T>& addr, T expected)
    {
      KeepErrno k;
      static_assert(
        sizeof(T) == sizeof(WaitingWord) && alignof(T) == alignof(WaitingWord),
        "T must be the same size and alignment as WaitingWord");
      while (addr.load(stl::memory_order_relaxed) == expected)
      {
        // Man page
        // (https://www.man7.org/linux/man-pages/man2/futex.2.html#RETURN_VALUE)
        // says:
        //  FUTEX_WAIT
        //    Returns 0 if the caller was woken up.  Note that a wake-up
        //    can also be caused by common futex usage patterns in
        //    unrelated code that happened to have previously used the
        //    futex word's memory location (e.g., typical futex-based
        //    implementations of Pthreads mutexes can cause this under
        //    some conditions).  Therefore, callers should always
        //    conservatively assume that a return value of 0 can mean a
        //    spurious wake-up, and use the futex word's value (i.e., the
        //    user-space synchronization scheme) to decide whether to
        //    continue to block or not.
        // We ignore the return and recheck.
        syscall(
          SYS_futex, &addr, FUTEX_WAIT_PRIVATE, expected, nullptr, nullptr, 0);
      }
    }